

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::mark_struct_members_packed(CompilerMSL *this,SPIRType *type)

{
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  TypedID *this_00;
  SPIRType *local_30;
  SPIRType *struct_type;
  SPIRType *mbr_type;
  uint32_t i;
  uint32_t mbr_cnt;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  Compiler::set_extended_decoration((Compiler *)this,uVar2,SPIRVCrossDecorationPhysicalTypePacked,0)
  ;
  sVar3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                    (&(type->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
  for (mbr_type._0_4_ = 0; (uint)mbr_type < (uint)sVar3; mbr_type._0_4_ = (uint)mbr_type + 1) {
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        (&(type->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                         (ulong)(uint)mbr_type);
    uVar2 = TypedID::operator_cast_to_unsigned_int(this_00);
    local_30 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    if (*(int *)&(local_30->super_IVariant).field_0xc == 0xf) {
      while (bVar1 = VectorView<unsigned_int>::empty
                               (&(local_30->array).super_VectorView<unsigned_int>),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_30->parent_type);
        local_30 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
      }
      mark_struct_members_packed(this,local_30);
    }
    else {
      bVar1 = Compiler::is_scalar((Compiler *)this,local_30);
      if (!bVar1) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
        Compiler::set_extended_member_decoration
                  ((Compiler *)this,uVar2,(uint)mbr_type,SPIRVCrossDecorationPhysicalTypePacked,0);
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::mark_struct_members_packed(const SPIRType &type)
{
	set_extended_decoration(type.self, SPIRVCrossDecorationPhysicalTypePacked);

	// Problem case! Struct needs to be placed at an awkward alignment.
	// Mark every member of the child struct as packed.
	uint32_t mbr_cnt = uint32_t(type.member_types.size());
	for (uint32_t i = 0; i < mbr_cnt; i++)
	{
		auto &mbr_type = get<SPIRType>(type.member_types[i]);
		if (mbr_type.basetype == SPIRType::Struct)
		{
			// Recursively mark structs as packed.
			auto *struct_type = &mbr_type;
			while (!struct_type->array.empty())
				struct_type = &get<SPIRType>(struct_type->parent_type);
			mark_struct_members_packed(*struct_type);
		}
		else if (!is_scalar(mbr_type))
			set_extended_member_decoration(type.self, i, SPIRVCrossDecorationPhysicalTypePacked);
	}
}